

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O1

MPP_RET put_frame(Kmpp *ctx,MppFrame frame)

{
  RK_U32 RVar1;
  MppFrameFormat MVar2;
  int iVar3;
  RK_S32 RVar4;
  MPP_RET MVar5;
  MppBuffer buffer;
  MppMeta meta;
  KmppFrameInfos frame_info;
  MppEncROICfg *roi_data;
  MppPacket packet;
  MppEncROICfgLegacy roi_data0;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  uint *local_c0;
  MppPacket local_b8;
  undefined4 local_b0;
  uint local_ac;
  undefined1 local_a8 [128];
  
  if (ctx == (Kmpp *)0x0) {
    MVar5 = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    MVar5 = MPP_ERR_INIT;
  }
  else {
    buffer = mpp_frame_get_buffer(frame);
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    RVar1 = mpp_frame_get_width(frame);
    local_138 = CONCAT44(local_138._4_4_,RVar1);
    RVar1 = mpp_frame_get_height(frame);
    local_138 = CONCAT44(RVar1,(undefined4)local_138);
    RVar1 = mpp_frame_get_hor_stride(frame);
    uStack_130 = CONCAT44(uStack_130._4_4_,RVar1);
    RVar1 = mpp_frame_get_ver_stride(frame);
    uStack_130 = CONCAT44(RVar1,(undefined4)uStack_130);
    RVar1 = mpp_frame_get_hor_stride_pixel(frame);
    local_128 = CONCAT44(local_128._4_4_,RVar1);
    RVar1 = mpp_frame_get_offset_x(frame);
    local_128 = CONCAT44(RVar1,(undefined4)local_128);
    RVar1 = mpp_frame_get_offset_y(frame);
    uStack_120 = CONCAT44(uStack_120._4_4_,RVar1);
    MVar2 = mpp_frame_get_fmt(frame);
    uStack_120 = CONCAT44(MVar2,(undefined4)uStack_120);
    iVar3 = mpp_buffer_get_fd_with_caller(buffer,"put_frame");
    local_118 = CONCAT44(local_118._4_4_,iVar3);
    RVar4 = mpp_frame_has_meta(frame);
    if (RVar4 != 0) {
      meta = mpp_frame_get_meta(frame);
      local_b8 = (MppPacket)0x0;
      mpp_meta_get_packet(meta,KEY_OUTPUT_PACKET,&local_b8);
      ctx->mPacket = local_b8;
      local_c0 = (uint *)0x0;
      mpp_meta_get_ptr(meta,KEY_ROI_DATA,&local_c0);
      if (local_c0 != (uint *)0x0) {
        local_b0 = 1;
        local_ac = *local_c0;
        memcpy(local_a8,*(void **)(local_c0 + 2),(ulong)local_ac << 4);
        (*ctx->mApi->control)(ctx,MPP_ENC_SET_ROI_CFG,&local_b0);
      }
    }
    MVar5 = mpp_vcodec_ioctl(ctx->mClientFd,0x400,0,0x78,&local_138);
    if (MVar5 != MPP_OK) {
      _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_IN_FRM_RDY failed\n",(char *)0x0,
                 (ulong)(uint)ctx->mChanId);
    }
  }
  return MVar5;
}

Assistant:

static MPP_RET put_frame(Kmpp *ctx, MppFrame frame)
{
    KmppFrameInfos frame_info;
    MppBuffer buf = NULL;
    MPP_RET ret = MPP_OK;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    buf = mpp_frame_get_buffer(frame);
    memset(&frame_info, 0, sizeof(frame_info));
    frame_info.width = mpp_frame_get_width(frame);
    frame_info.height = mpp_frame_get_height(frame);
    frame_info.hor_stride = mpp_frame_get_hor_stride(frame);
    frame_info.ver_stride = mpp_frame_get_ver_stride(frame);
    frame_info.hor_stride_pixel = mpp_frame_get_hor_stride_pixel(frame);
    frame_info.offset_x = mpp_frame_get_offset_x(frame);
    frame_info.offset_y = mpp_frame_get_offset_y(frame);
    frame_info.fmt = mpp_frame_get_fmt(frame);
    frame_info.fd = mpp_buffer_get_fd(buf);
    // frame_info.pts = mpp_frame_get_pts(frame);
    // frame_info.jpeg_chan_id = mpp_frame_get_jpege_chan_id(frame);
    // frame_info.eos = mpp_frame_get_eos(frame);
    // frame_info.pskip = mpp_frame_get_pskip_request(frame);
    // frame_info.pskip_num = mpp_frame_get_pskip_num(frame);
    if (mpp_frame_has_meta(frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);
        MppPacket packet = NULL;

        mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);
        ctx->mPacket = packet;

        /* set roi */
        {
            MppEncROICfg *roi_data = NULL;
            MppEncROICfgLegacy roi_data0;

            mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void**)&roi_data);
            if (roi_data) {
                roi_data0.change = 1;
                roi_data0.number = roi_data->number;
                memcpy(roi_data0.regions, roi_data->regions, roi_data->number * sizeof(MppEncROIRegion));
                ctx->mApi->control(ctx, MPP_ENC_SET_ROI_CFG, &roi_data0);
            }
        }
    }

    ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_IN_FRM_RDY, 0, sizeof(frame_info), &frame_info);
    if (ret)
        mpp_err("chan %d VCODEC_CHAN_IN_FRM_RDY failed\n", ctx->mChanId);

    return ret;
}